

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::auto_insert_sync_reset(Generator *top)

{
  undefined1 local_a8 [8];
  InsertSyncReset visitor;
  
  InsertSyncReset::InsertSyncReset((InsertSyncReset *)local_a8,top);
  IRVisitor::visit_generator_root_p((IRVisitor *)local_a8,top);
  local_a8 = (undefined1  [8])&PTR_visit_root_002ab4a8;
  if ((size_type *)visitor.reset_name_.field_2._8_8_ != &visitor.sync_reset_name._M_string_length) {
    operator_delete((void *)visitor.reset_name_.field_2._8_8_,
                    visitor.sync_reset_name._M_string_length + 1);
  }
  if ((size_type *)visitor._72_8_ != &visitor.reset_name_._M_string_length) {
    operator_delete((void *)visitor._72_8_,visitor.reset_name_._M_string_length + 1);
  }
  local_a8 = (undefined1  [8])&PTR_visit_root_002a7338;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void auto_insert_sync_reset(Generator* top) {
    InsertSyncReset visitor(top);
    visitor.visit_generator_root_p(top);
}